

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::
field<char[7],std::vector<pstack::Dwarf::LineState,std::allocator<pstack::Dwarf::LineState>>,char>
          (JObject *this,char (*k) [7],
          vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_> *v,char *c)

{
  ostream *os;
  undefined1 local_40 [8];
  Field<char[7],_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
  field;
  
  local_40 = (undefined1  [8])k;
  field.k = (char (*) [7])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_> *)local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[7],_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>,_char>
                         *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }